

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_0::RenderCountCase::calibrate(RenderCountCase *this)

{
  int iVar1;
  State SVar2;
  undefined4 extraout_var;
  TestLog *log_00;
  deUint64 dVar4;
  deUint64 dVar5;
  deInt64 prev;
  deInt64 now;
  undefined4 local_498;
  deUint8 buffer [4];
  undefined1 local_478 [8];
  TheilSenCalibrator calibrator;
  undefined1 local_330 [8];
  RenderData occludedGeometry;
  ObjectData local_218;
  undefined1 local_130 [8];
  RenderData occluderGeometry;
  TestLog *log;
  Functions *gl;
  RenderCountCase *this_local;
  long lVar3;
  
  iVar1 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  occluderGeometry._256_8_ =
       tcu::TestContext::getLog((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx);
  (*(this->super_BaseCase).super_TestCase.super_TestNode._vptr_TestNode[7])();
  RenderData::RenderData
            ((RenderData *)local_130,&local_218,(this->super_BaseCase).m_renderCtx,
             (TestLog *)occluderGeometry._256_8_);
  ObjectData::~ObjectData(&local_218);
  (*(this->super_BaseCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (&calibrator.m_calibrateIterations.
              super__Vector_base<deqp::gls::CalibrateIteration,_std::allocator<deqp::gls::CalibrateIteration>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  RenderData::RenderData
            ((RenderData *)local_330,
             (ObjectData *)
             &calibrator.m_calibrateIterations.
              super__Vector_base<deqp::gls::CalibrateIteration,_std::allocator<deqp::gls::CalibrateIteration>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(this->super_BaseCase).m_renderCtx,
             (TestLog *)occluderGeometry._256_8_);
  ObjectData::~ObjectData
            ((ObjectData *)
             &calibrator.m_calibrateIterations.
              super__Vector_base<deqp::gls::CalibrateIteration,_std::allocator<deqp::gls::CalibrateIteration>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  deqp::gls::CalibratorParameters::CalibratorParameters
            ((CalibratorParameters *)buffer,0x14,10,20.0,0x14,33.0,40.0,1000.0);
  deqp::gls::TheilSenCalibrator::TheilSenCalibrator
            ((TheilSenCalibrator *)local_478,(CalibratorParameters *)buffer);
  while( true ) {
    while (SVar2 = deqp::gls::TheilSenCalibrator::getState((TheilSenCalibrator *)local_478),
          SVar2 == STATE_RECOMPUTE_PARAMS) {
      deqp::gls::TheilSenCalibrator::recomputeParameters((TheilSenCalibrator *)local_478);
    }
    if (SVar2 != STATE_MEASURE) break;
    dVar4 = deGetMicroseconds();
    (**(code **)(lVar3 + 0x188))(0x4500);
    (**(code **)(lVar3 + 0x4e8))(0xb71);
    BaseCase::render(&this->super_BaseCase,(RenderData *)local_130);
    iVar1 = deqp::gls::TheilSenCalibrator::getCallCount((TheilSenCalibrator *)local_478);
    BaseCase::render(&this->super_BaseCase,(RenderData *)local_330,iVar1);
    (**(code **)(lVar3 + 0x1220))(0,0,1,1,0x1908,0x1401,(long)&now + 4);
    dVar5 = deGetMicroseconds();
    deqp::gls::TheilSenCalibrator::recordIteration((TheilSenCalibrator *)local_478,dVar5 - dVar4);
  }
  if (SVar2 == STATE_FINISHED) {
    log_00 = tcu::TestContext::getLog
                       ((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx);
    deqp::gls::logCalibrationInfo(log_00,(TheilSenCalibrator *)local_478);
    this_local._4_4_ = deqp::gls::TheilSenCalibrator::getCallCount((TheilSenCalibrator *)local_478);
  }
  else {
    this_local._4_4_ = 1;
  }
  local_498 = 1;
  deqp::gls::TheilSenCalibrator::~TheilSenCalibrator((TheilSenCalibrator *)local_478);
  RenderData::~RenderData((RenderData *)local_330);
  RenderData::~RenderData((RenderData *)local_130);
  return this_local._4_4_;
}

Assistant:

int RenderCountCase::calibrate (void) const
{
	using namespace gls;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();

	const RenderData		occluderGeometry	(genOccluderGeometry(), m_renderCtx, log);
	const RenderData		occludedGeometry	(genOccludedGeometry(), m_renderCtx, log);

	TheilSenCalibrator		calibrator			(CalibratorParameters(20, // Initial workload
																	  10, // Max iteration frames
																	  20.0f, // Iteration shortcut threshold ms
																	  20, // Max iterations
																	  33.0f, // Target frame time
																	  40.0f, // Frame time cap
																	  1000.0f // Target measurement duration
																	  ));

	while (true)
	{
		switch(calibrator.getState())
		{
			case TheilSenCalibrator::STATE_FINISHED:
				logCalibrationInfo(m_testCtx.getLog(), calibrator);
				return calibrator.getCallCount();

			case TheilSenCalibrator::STATE_MEASURE:
			{
				deUint8	buffer[4];
				deInt64 now;
				deInt64 prev;

				prev = deGetMicroseconds();

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
				gl.disable(GL_DEPTH_TEST);

				render(occluderGeometry);
				render(occludedGeometry, calibrator.getCallCount());

				gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

				now = deGetMicroseconds();

				calibrator.recordIteration(now - prev);
				break;
			}

			case TheilSenCalibrator::STATE_RECOMPUTE_PARAMS:
				calibrator.recomputeParameters();
				break;
			default:
				DE_ASSERT(false);
				return 1;
		}
	}
}